

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O2

uchar * nvpair_unpack_string_array(_Bool isbe,nvpair_t *nvp,uchar *ptr,size_t *leftp)

{
  size_t sVar1;
  int *piVar2;
  void *__ptr;
  char *__s;
  ulong uVar3;
  uint uVar4;
  uchar *__string;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  
  if (nvp->nvp_type != 10) {
    __assert_fail("nvp->nvp_type == 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x3be,
                  "const unsigned char *nvpair_unpack_string_array(_Bool, nvpair_t *, const unsigned char *, size_t *)"
                 );
  }
  uVar6 = *leftp;
  sVar7 = nvp->nvp_datasize;
  if ((sVar7 - 1 < uVar6) && (uVar3 = nvp->nvp_nitems, uVar3 != 0)) {
    __string = ptr;
    for (uVar5 = 0; uVar5 < uVar3; uVar5 = (ulong)((int)uVar5 + 1)) {
      sVar1 = strnlen((char *)__string,sVar7 - 1);
      sVar7 = sVar7 - (sVar1 + 1);
      if ((long)sVar7 < 0) goto LAB_0010c5df;
      __string = __string + sVar1 + 1;
    }
    if (sVar7 == 0) {
      __ptr = malloc(uVar3 * 8);
      uVar4 = 0;
      if (__ptr == (void *)0x0) {
        return (uchar *)0x0;
      }
      while( true ) {
        uVar5 = (ulong)uVar4;
        if (uVar3 <= uVar5) {
          nvp->nvp_data = (uint64_t)__ptr;
          return ptr;
        }
        __s = strdup((char *)ptr);
        *(char **)((long)__ptr + uVar5 * 8) = __s;
        if (__s == (char *)0x0) break;
        sVar1 = strlen(__s);
        uVar6 = uVar6 - (sVar1 + 1);
        ptr = ptr + sVar1 + 1;
        *leftp = uVar6;
        uVar4 = uVar4 + 1;
        uVar3 = nvp->nvp_nitems;
      }
      for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        free(*(void **)((long)__ptr + uVar6 * 8));
      }
      free(__ptr);
      return (uchar *)0x0;
    }
  }
LAB_0010c5df:
  piVar2 = __errno_location();
  *piVar2 = 0x16;
  return (uchar *)0x0;
}

Assistant:

const unsigned char *
nvpair_unpack_string_array(bool isbe __unused, nvpair_t *nvp,
    const unsigned char *ptr, size_t *leftp)
{
	ssize_t size;
	size_t len;
	const char *tmp;
	char **value;
	unsigned int ii, j;

	PJDLOG_ASSERT(nvp->nvp_type == NV_TYPE_STRING_ARRAY);

	if (*leftp < nvp->nvp_datasize || nvp->nvp_datasize == 0 ||
	    nvp->nvp_nitems == 0) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	size = nvp->nvp_datasize;
	tmp = (const char *)ptr;
	for (ii = 0; ii < nvp->nvp_nitems; ii++) {
		len = strnlen(tmp, size - 1) + 1;
		size -= len;
		if (size < 0) {
			ERRNO_SET(EINVAL);
			return (NULL);
		}
		tmp += len;
	}
	if (size != 0) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	value = nv_malloc(sizeof(*value) * nvp->nvp_nitems);
	if (value == NULL)
		return (NULL);

	for (ii = 0; ii < nvp->nvp_nitems; ii++) {
		value[ii] = nv_strdup((const char *)ptr);
		if (value[ii] == NULL)
			goto out;
		len = strlen(value[ii]) + 1;
		ptr += len;
		*leftp -= len;
	}
	nvp->nvp_data = (uint64_t)(uintptr_t)value;

	return (ptr);
out:
	for (j = 0; j < ii; j++)
		nv_free(value[j]);
	nv_free(value);
	return (NULL);
}